

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmJoin<std::vector<int,std::allocator<int>>>
                   (string *__return_storage_ptr__,vector<int,_std::allocator<int>_> *rng,
                   string_view separator)

{
  int *piVar1;
  ostream *this;
  int *piVar2;
  ostringstream os;
  ostream oStack_1a8;
  
  if ((rng->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
      == (rng->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_1a8);
    piVar2 = (rng->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar1 = (rng->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    std::ostream::operator<<(&oStack_1a8,*piVar2);
    while (piVar2 = piVar2 + 1, piVar2 != piVar1) {
      this = std::__ostream_insert<char,std::char_traits<char>>
                       (&oStack_1a8,separator._M_str,separator._M_len);
      std::ostream::operator<<(this,*piVar2);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& rng, cm::string_view separator)
{
  if (rng.empty()) {
    return std::string();
  }

  std::ostringstream os;
  auto it = rng.begin();
  auto const end = rng.end();
  os << *it;
  while (++it != end) {
    os << separator << *it;
  }
  return os.str();
}